

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint getPaletteTranslucency(uchar *palette,size_t palettesize)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  long lVar4;
  size_t sVar5;
  uint uVar6;
  
  if (palettesize == 0) {
    return 0;
  }
  uVar1 = '\0';
  uVar2 = '\0';
  uVar3 = '\0';
  uVar6 = 0;
  sVar5 = 0;
  do {
    if ((uVar6 == 0) && (palette[sVar5 * 4 + 3] == '\0')) {
      lVar4 = sVar5 * 4;
      uVar3 = palette[lVar4];
      uVar2 = palette[lVar4 + 1];
      uVar1 = palette[lVar4 + 2];
      uVar6 = 1;
      sVar5 = 0xffffffffffffffff;
    }
    else {
      if (palette[sVar5 * 4 + 3] != 0xff) {
        return 2;
      }
      if (uVar6 == 0) {
        uVar6 = 0;
      }
      else {
        lVar4 = sVar5 * 4;
        uVar6 = 1;
        if (((uVar3 == palette[lVar4]) && (uVar2 == palette[lVar4 + 1])) &&
           (uVar1 == palette[lVar4 + 2])) {
          return 2;
        }
      }
    }
    sVar5 = sVar5 + 1;
    if (sVar5 == palettesize) {
      return uVar6;
    }
  } while( true );
}

Assistant:

static unsigned getPaletteTranslucency(const unsigned char* palette, size_t palettesize)
{
	size_t i;
	unsigned key = 0;
	unsigned r = 0, g = 0, b = 0; /*the value of the color with alpha 0, so long as color keying is possible*/
	for (i = 0; i != palettesize; ++i)
	{
		if (!key && palette[4 * i + 3] == 0)
		{
			r = palette[4 * i + 0]; g = palette[4 * i + 1]; b = palette[4 * i + 2];
			key = 1;
			i = (size_t)(-1); /*restart from beginning, to detect earlier opaque colors with key's value*/
		}
		else if (palette[4 * i + 3] != 255) return 2;
		/*when key, no opaque RGB may have key's RGB*/
		else if (key && r == palette[i * 4 + 0] && g == palette[i * 4 + 1] && b == palette[i * 4 + 2]) return 2;
	}
	return key;
}